

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_compressed.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long in_RSI;
  int in_EDI;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  int idx;
  int h;
  int w;
  ALLEGRO_EVENT event;
  int block_height;
  int block_width;
  int bitmap_format;
  double t1;
  double t0;
  BITMAP_TYPE bitmaps [4];
  _Bool compare;
  int cur_bitmap;
  int ii;
  _Bool redraw;
  ALLEGRO_BITMAP *bkg;
  ALLEGRO_FONT *font;
  ALLEGRO_EVENT_QUEUE *queue;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  char *filename;
  int local_1dc;
  undefined4 local_180 [8];
  int local_160;
  int local_134;
  long local_118 [4];
  long alStack_f8 [21];
  byte local_4d;
  int local_4c;
  int local_48;
  byte local_41;
  long local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long local_20;
  char *local_18;
  long local_10;
  int local_8;
  undefined4 local_4;
  
  local_4 = 0;
  local_41 = 1;
  local_4c = 0;
  local_4d = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_118,&DAT_00104bd0,0xc0);
  if (local_8 < 2) {
    local_18 = "data/mysha.pcx";
  }
  else {
    local_18 = *(char **)(local_10 + 8);
  }
  uVar4 = al_install_system(0x5020700,atexit);
  if ((uVar4 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  open_log();
  if (2 < local_8) {
    iVar1 = atoi(*(char **)(local_10 + 0x10));
    al_set_new_display_adapter(iVar1);
  }
  al_init_image_addon();
  al_init_font_addon();
  al_install_keyboard();
  local_20 = al_create_display(0x280,0x1e0);
  if (local_20 == 0) {
    abort_example("Error creating display\n");
  }
  for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
    al_set_new_bitmap_format((int)alStack_f8[(long)local_48 * 6]);
    dVar8 = (double)al_get_time();
    lVar5 = al_load_bitmap(local_18);
    local_118[(long)local_48 * 6] = lVar5;
    dVar9 = (double)al_get_time();
    if (local_118[(long)local_48 * 6] == 0) {
      abort_example("%s not found or failed to load\n",local_18);
    }
    log_printf((char *)(dVar9 - dVar8),"%s load time: %f sec\n",alStack_f8[(long)local_48 * 6 + 1]);
    dVar8 = (double)al_get_time();
    lVar5 = al_clone_bitmap(local_118[(long)local_48 * 6]);
    local_118[(long)local_48 * 6 + 1] = lVar5;
    dVar9 = (double)al_get_time();
    if (local_118[(long)local_48 * 6 + 1] == 0) {
      abort_example("Couldn\'t clone %s\n",alStack_f8[(long)local_48 * 6 + 1]);
    }
    log_printf((char *)(dVar9 - dVar8),"%s clone time: %f sec\n",alStack_f8[(long)local_48 * 6 + 1])
    ;
    al_set_new_bitmap_format(0);
    dVar8 = (double)al_get_time();
    lVar5 = al_clone_bitmap(local_118[(long)local_48 * 6]);
    local_118[(long)local_48 * 6 + 2] = lVar5;
    dVar9 = (double)al_get_time();
    if (local_118[(long)local_48 * 6 + 2] == 0) {
      abort_example("Couldn\'t decompress %s\n",alStack_f8[(long)local_48 * 6 + 1]);
    }
    log_printf((char *)(dVar9 - dVar8),"%s decompress time: %f sec\n",
               alStack_f8[(long)local_48 * 6 + 1]);
    al_set_new_bitmap_format((int)alStack_f8[(long)local_48 * 6]);
    lVar5 = al_clone_bitmap(local_118[(long)local_48 * 6]);
    alStack_f8[(long)local_48 * 6 + -1] = lVar5;
    if (alStack_f8[(long)local_48 * 6 + -1] == 0) {
      abort_example("Couldn\'t clone %s\n",alStack_f8[(long)local_48 * 6 + 1]);
    }
    iVar1 = al_get_bitmap_width(local_118[(long)local_48 * 6]);
    if ((0x80 < iVar1) &&
       (iVar1 = al_get_bitmap_height(local_118[(long)local_48 * 6]), 0x80 < iVar1)) {
      uVar2 = al_get_bitmap_format(local_118[(long)local_48 * 6]);
      iVar1 = al_get_pixel_block_width(uVar2);
      local_134 = al_get_pixel_block_height(uVar2);
      al_lock_bitmap_region_blocked
                (alStack_f8[(long)local_48 * 6 + -1],0x10 / (long)iVar1 & 0xffffffff,
                 0x10 / (long)local_134 & 0xffffffff,0x40 / (long)iVar1 & 0xffffffff,
                 0x40 / (long)local_134 & 0xffffffff,0);
      al_unlock_bitmap(alStack_f8[(long)local_48 * 6 + -1]);
    }
  }
  local_40 = al_load_bitmap("data/bkg.png");
  if (local_40 == 0) {
    abort_example("data/bkg.png not found or failed to load\n");
  }
  al_set_new_bitmap_format(0);
  local_38 = al_create_builtin_font();
  local_28 = al_create_timer(0x3fa1111111111111);
  uVar6 = al_create_event_queue();
  local_30 = uVar6;
  uVar7 = al_get_display_event_source(local_20);
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_30;
  uVar7 = al_get_keyboard_event_source();
  al_register_event_source(uVar6,uVar7);
  uVar6 = local_30;
  uVar7 = al_get_timer_event_source(local_28);
  al_register_event_source(uVar6,uVar7);
  al_start_timer(local_28);
  do {
    al_wait_for_event(local_30,local_180);
    switch(local_180[0]) {
    case 10:
      switch(local_160) {
      case 0x3b:
        goto LAB_00102ea7;
      case 0x4b:
        local_4d = 1;
        break;
      case 0x52:
        local_4c = (local_4c + 3) % 4;
        break;
      case 0x53:
        local_4c = (local_4c + 1) % 4;
      }
      break;
    case 0xc:
      if (local_160 == 0x4b) {
        local_4d = 0;
      }
      break;
    case 0x1e:
      local_41 = 1;
      break;
    case 0x2a:
LAB_00102ea7:
      al_destroy_bitmap();
      for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
        al_destroy_bitmap();
      }
      close_log(false);
      return 0;
    }
    if (((local_41 & 1) != 0) && (uVar4 = al_is_event_queue_empty(local_30), (uVar4 & 1) != 0)) {
      iVar1 = al_get_bitmap_width(local_118[(long)local_4c * 6]);
      iVar3 = al_get_bitmap_height(local_118[(long)local_4c * 6]);
      if ((local_4d & 1) == 0) {
        local_1dc = local_4c;
      }
      else {
        local_1dc = 0;
      }
      local_41 = 0;
      uVar7 = 0;
      uVar6 = al_map_rgb_f(0);
      al_clear_to_color(uVar6,uVar7);
      al_draw_bitmap(0,local_40,0);
      uVar6 = local_38;
      uVar10 = 0x3f800000;
      uVar7 = al_map_rgb_f(0x3f800000);
      al_draw_textf(uVar7,uVar10,uVar6,0,"SPACE to compare. Arrows to switch. Format: %s",
                    alStack_f8[(long)local_1dc * 6 + 1]);
      al_draw_bitmap(0,0x41a00000,local_118[(long)local_1dc * 6],0);
      uVar2 = 0;
      al_draw_bitmap((float)iVar1,0x41a00000,local_118[(long)local_1dc * 6 + 1],0);
      al_draw_bitmap(0,CONCAT44(uVar2,(float)(iVar3 + 0x14)),local_118[(long)local_1dc * 6 + 2],0);
      al_draw_bitmap((float)iVar1,(float)(iVar3 + 0x14),alStack_f8[(long)local_1dc * 6 + -1],0);
      al_flip_display();
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   const char *filename;
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *bkg;
   bool redraw = true;
   int ii;
   int cur_bitmap = 0;
   bool compare = false;
   #define NUM_BITMAPS 4
   BITMAP_TYPE bitmaps[NUM_BITMAPS] = {
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_ANY,       "Uncompressed"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT1, "DXT1"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT3, "DXT3"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT5, "DXT5"},
   };

   if (argc > 1) {
      filename = argv[1];
   }
   else {
      filename = "data/mysha.pcx";
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc > 2) {
      al_set_new_display_adapter(atoi(argv[2]));
   }

   al_init_image_addon();
   al_init_font_addon();
   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }

   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      double t0, t1;
      al_set_new_bitmap_format(bitmaps[ii].format);

      /* Load */
      t0 = al_get_time();
      bitmaps[ii].bmp = al_load_bitmap(filename);
      t1 = al_get_time();

      if (!bitmaps[ii].bmp) {
         abort_example("%s not found or failed to load\n", filename);
      }
      log_printf("%s load time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Clone */
      t0 = al_get_time();
      bitmaps[ii].clone = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }
      log_printf("%s clone time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Decompress */
      al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
      t0 = al_get_time();
      bitmaps[ii].decomp = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].decomp) {
         abort_example("Couldn't decompress %s\n", bitmaps[ii].name);
      }
      log_printf("%s decompress time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* RW lock */
      al_set_new_bitmap_format(bitmaps[ii].format);
      bitmaps[ii].lock_clone = al_clone_bitmap(bitmaps[ii].bmp);

      if (!bitmaps[ii].lock_clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }

      if (al_get_bitmap_width(bitmaps[ii].bmp) > 128
            && al_get_bitmap_height(bitmaps[ii].bmp) > 128) {
         int bitmap_format = al_get_bitmap_format(bitmaps[ii].bmp);
         int block_width = al_get_pixel_block_width(bitmap_format);
         int block_height = al_get_pixel_block_height(bitmap_format);

         /* Lock and unlock it, hopefully causing a no-op operation */
         al_lock_bitmap_region_blocked(bitmaps[ii].lock_clone,
            16 / block_width, 16 / block_height, 64 / block_width,
            64 / block_height, ALLEGRO_LOCK_READWRITE);

         al_unlock_bitmap(bitmaps[ii].lock_clone);
      }
   }

   bkg = al_load_bitmap("data/bkg.png");
   if (!bkg) {
      abort_example("data/bkg.png not found or failed to load\n");
   }

   al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
   font = al_create_builtin_font();
   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            goto EXIT;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_LEFT:
                  cur_bitmap = (cur_bitmap - 1 + NUM_BITMAPS) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_RIGHT:
                  cur_bitmap = (cur_bitmap + 1) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_SPACE:
                  compare = true;
                  break;
               case ALLEGRO_KEY_ESCAPE:
                  goto EXIT;
            }
            break;
         case ALLEGRO_EVENT_KEY_UP:
            if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               compare = false;
            }
            break;
      }
      if (redraw && al_is_event_queue_empty(queue)) {
         int w = al_get_bitmap_width(bitmaps[cur_bitmap].bmp);
         int h = al_get_bitmap_height(bitmaps[cur_bitmap].bmp);
         int idx = compare ? 0 : cur_bitmap;
         redraw = false;
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_draw_bitmap(bkg, 0, 0, 0);
         al_draw_textf(font, al_map_rgb_f(1, 1, 1), 5, 5, ALLEGRO_ALIGN_LEFT,
            "SPACE to compare. Arrows to switch. Format: %s", bitmaps[idx].name);
         al_draw_bitmap(bitmaps[idx].bmp, 0, 20, 0);
         al_draw_bitmap(bitmaps[idx].clone, w, 20, 0);
         al_draw_bitmap(bitmaps[idx].decomp, 0, 20 + h, 0);
         al_draw_bitmap(bitmaps[idx].lock_clone, w, 20 + h, 0);
         al_flip_display();
      }
   }
EXIT:

   al_destroy_bitmap(bkg);
   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      al_destroy_bitmap(bitmaps[ii].bmp);
   }

   close_log(false);

   return 0;
}